

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Output.h
# Opt level: O2

void __thiscall OutputContext::OutputContext(OutputContext *this)

{
  this->outputBuf = this->outputBufDef;
  this->outputBufSize = 0x100;
  this->outputBufPos = 0;
  this->tempBuf = this->tempBufDef;
  this->tempBufSize = 0x100;
  this->stream = (void *)0x0;
  this->openStream = FileOpen;
  this->writeStream = FileWrite;
  this->closeStream = FileClose;
  return;
}

Assistant:

OutputContext()
	{
		outputBuf = outputBufDef;
		outputBufSize = 256;
		outputBufPos = 0;

		tempBuf = tempBufDef;
		tempBufSize = 256;

		stream = 0;

		openStream = FileOpen;
		writeStream = FileWrite;
		closeStream = FileClose;
	}